

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O0

void run_CALL(WorkerP *w,Task *__dq_head)

{
  long lVar1;
  FILE *pFVar2;
  MTBDD MVar3;
  BDD BVar4;
  BDD BVar5;
  size_t sVar6;
  MTBDD *a;
  double dVar7;
  double dVar8;
  undefined8 uStack_220;
  undefined1 auStack_218 [8];
  FILE *local_210;
  size_t local_208;
  double local_200;
  FILE *local_1f8;
  double local_1f0;
  FILE *local_1e8;
  BDD local_1e0;
  FILE *local_1d8;
  FILE *local_1d0;
  FILE *local_1c8;
  double local_1c0;
  BDD local_1b8;
  BDD local_1b0;
  FILE *local_1a8;
  FILE *local_1a0;
  FILE *local_198;
  double local_190;
  BDD local_188;
  BDD local_180;
  FILE *local_178;
  FILE *local_170;
  FILE *local_168;
  double local_160;
  BDD local_158;
  BDD local_150;
  FILE *local_148;
  FILE *local_140;
  FILE *local_138;
  double local_130;
  BDD local_128;
  BDD local_120;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  Task *local_f0;
  Task *__dq_head_local;
  WorkerP *w_local;
  double t2;
  size_t j_4;
  size_t i_6;
  size_t k_3;
  size_t j_3;
  size_t i_5;
  size_t k_2;
  size_t j_2;
  size_t i_4;
  size_t k_1;
  size_t i_3;
  size_t j_1;
  size_t k;
  size_t j;
  size_t i_2;
  size_t i_1;
  BDD vars;
  BDD temp;
  BDD res;
  size_t i;
  unsigned_long __vla_expr0;
  size_t local_30;
  BDD one;
  BDD zero;
  double t1;
  WorkerP *local_10;
  
  local_100 = auStack_218;
  uStack_220 = 0x10255e;
  local_f0 = __dq_head;
  __dq_head_local = (Task *)w;
  t1 = (double)__dq_head;
  local_10 = w;
  zero = (BDD)wctime();
  one = 0;
  local_30 = 0x8000000000000000;
  i = size * size;
  lVar1 = -(i * 8 + 0xf & 0xfffffffffffffff0);
  local_f8 = auStack_218 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_218;
  for (res = 0; BVar5 = res, res < size * size; res = res + 1) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1025d6;
    MVar3 = mtbdd_ithvar((uint32_t)BVar5);
    *(MTBDD *)(local_f8 + res * 8) = MVar3;
    a = (MTBDD *)(local_f8 + res * 8);
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1025f8;
    mtbdd_protect(a);
  }
  temp = local_30;
  vars = local_30;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10261f;
  mtbdd_protect(&temp);
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102628;
  mtbdd_protect(&vars);
  i_1 = local_30;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102639;
  mtbdd_protect(&i_1);
  for (i_2 = 0; sVar6 = i_1, i_2 < size * size; i_2 = i_2 + 1) {
    BVar5 = *(BDD *)(local_f8 + i_2 * 8);
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102673;
    i_1 = sylvan_and_RUN(sVar6,BVar5,0);
  }
  local_108 = _stdout;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10269b;
  dVar7 = wctime();
  pFVar2 = local_108;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1026b8;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",dVar7 - t_start);
  if (report_minor == 0) {
    local_118 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10270c;
    dVar7 = wctime();
    pFVar2 = local_118;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102729;
    fprintf(pFVar2,"[% 8.2f] Encoding rows...\n",dVar7 - t_start);
  }
  else {
    local_110 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1026d7;
    dVar7 = wctime();
    pFVar2 = local_110;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1026f4;
    fprintf(pFVar2,"[% 8.2f] Encoding rows... ",dVar7 - t_start);
  }
  for (j = 0; sVar6 = j, j < size; j = j + 1) {
    if (report_minor != 0) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10275d;
      printf("%zu... ",sVar6);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10276c;
      fflush(_stdout);
    }
    for (k = 0; k < size; k = k + 1) {
      vars = local_30;
      for (j_1 = 0; BVar5 = vars, j_1 < size; j_1 = j_1 + 1) {
        if (k != j_1) {
          local_120 = vars;
          BVar5 = *(BDD *)(local_f8 + (j * size + j_1) * 8);
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1027d9;
          BVar4 = sylvan_not(BVar5);
          BVar5 = local_120;
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1027ea;
          vars = sylvan_and_RUN(BVar5,BVar4,0);
        }
      }
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102805;
      local_128 = sylvan_not(BVar5);
      BVar5 = *(BDD *)(local_f8 + (j * size + k) * 8);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10282f;
      BVar5 = sylvan_not(BVar5);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102837;
      BVar4 = sylvan_not(BVar5);
      BVar5 = local_128;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102848;
      BVar5 = sylvan_and_RUN(BVar5,BVar4,0);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102850;
      BVar4 = sylvan_not(BVar5);
      BVar5 = temp;
      vars = BVar4;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102863;
      temp = sylvan_and_RUN(BVar5,BVar4,0);
    }
  }
  if (report_minor != 0) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1028a0;
    printf("\n");
  }
  if (report_minterms != 0) {
    local_138 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1028bf;
    local_130 = wctime();
    BVar5 = temp;
    sVar6 = i_1;
    local_130 = local_130 - t_start;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1028de;
    dVar8 = sylvan_satcount_RUN(BVar5,sVar6,0);
    dVar7 = local_130;
    pFVar2 = local_138;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1028fe;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",dVar7,dVar8);
  }
  if (report_minor == 0) {
    local_148 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102952;
    dVar7 = wctime();
    pFVar2 = local_148;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10296f;
    fprintf(pFVar2,"[% 8.2f] Encoding columns...\n",dVar7 - t_start);
  }
  else {
    local_140 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10291d;
    dVar7 = wctime();
    pFVar2 = local_140;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10293a;
    fprintf(pFVar2,"[% 8.2f] Encoding columns... ",dVar7 - t_start);
  }
  for (i_3 = 0; sVar6 = i_3, i_3 < size; i_3 = i_3 + 1) {
    if (report_minor != 0) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1029a3;
      printf("%zu... ",sVar6);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1029b2;
      fflush(_stdout);
    }
    for (k_1 = 0; k_1 < size; k_1 = k_1 + 1) {
      vars = local_30;
      for (i_4 = 0; BVar5 = vars, i_4 < size; i_4 = i_4 + 1) {
        if (k_1 != i_4) {
          local_150 = vars;
          BVar5 = *(BDD *)(local_f8 + (i_4 * size + i_3) * 8);
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102a34;
          BVar4 = sylvan_not(BVar5);
          BVar5 = local_150;
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102a45;
          vars = sylvan_and_RUN(BVar5,BVar4,0);
        }
      }
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102a66;
      local_158 = sylvan_not(BVar5);
      BVar5 = *(BDD *)(local_f8 + (k_1 * size + i_3) * 8);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102a93;
      BVar5 = sylvan_not(BVar5);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102a9b;
      BVar4 = sylvan_not(BVar5);
      BVar5 = local_158;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102aac;
      BVar5 = sylvan_and_RUN(BVar5,BVar4,0);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ab4;
      BVar4 = sylvan_not(BVar5);
      BVar5 = temp;
      vars = BVar4;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ac7;
      temp = sylvan_and_RUN(BVar5,BVar4,0);
    }
  }
  if (report_minor != 0) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102b0a;
    printf("\n");
  }
  if (report_minterms != 0) {
    local_168 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102b29;
    local_160 = wctime();
    BVar5 = temp;
    sVar6 = i_1;
    local_160 = local_160 - t_start;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102b48;
    dVar8 = sylvan_satcount_RUN(BVar5,sVar6,0);
    dVar7 = local_160;
    pFVar2 = local_168;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102b68;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",dVar7,dVar8);
  }
  if (report_minor == 0) {
    local_178 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102bbc;
    dVar7 = wctime();
    pFVar2 = local_178;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102bd9;
    fprintf(pFVar2,"[% 8.2f] Encoding rising diagonals...\n",dVar7 - t_start);
  }
  else {
    local_170 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102b87;
    dVar7 = wctime();
    pFVar2 = local_170;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ba4;
    fprintf(pFVar2,"[% 8.2f] Encoding rising diagonals... ",dVar7 - t_start);
  }
  for (j_2 = 0; sVar6 = j_2, j_2 < size; j_2 = j_2 + 1) {
    if (report_minor != 0) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102c16;
      printf("%zu... ",sVar6);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102c25;
      fflush(_stdout);
    }
    for (k_2 = 0; k_2 < size; k_2 = k_2 + 1) {
      vars = local_30;
      for (i_5 = 0; BVar5 = vars, i_5 < size; i_5 = i_5 + 1) {
        if (((j_2 <= k_2 + i_5) && (k_2 + i_5 < size + j_2)) && (i_5 != j_2)) {
          local_180 = vars;
          BVar5 = *(BDD *)(local_f8 + (i_5 * size + ((k_2 + i_5) - j_2)) * 8);
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102cf9;
          BVar4 = sylvan_not(BVar5);
          BVar5 = local_180;
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d0a;
          vars = sylvan_and_RUN(BVar5,BVar4,0);
        }
      }
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d2e;
      local_188 = sylvan_not(BVar5);
      BVar5 = *(BDD *)(local_f8 + (j_2 * size + k_2) * 8);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d5e;
      BVar5 = sylvan_not(BVar5);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d66;
      BVar4 = sylvan_not(BVar5);
      BVar5 = local_188;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d77;
      BVar5 = sylvan_and_RUN(BVar5,BVar4,0);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d7f;
      BVar4 = sylvan_not(BVar5);
      BVar5 = temp;
      vars = BVar4;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102d92;
      temp = sylvan_and_RUN(BVar5,BVar4,0);
    }
  }
  if (report_minor != 0) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ddb;
    printf("\n");
  }
  if (report_minterms != 0) {
    local_198 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102dfa;
    local_190 = wctime();
    BVar5 = temp;
    sVar6 = i_1;
    local_190 = local_190 - t_start;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102e19;
    dVar8 = sylvan_satcount_RUN(BVar5,sVar6,0);
    dVar7 = local_190;
    pFVar2 = local_198;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102e39;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",dVar7,dVar8);
  }
  if (report_minor == 0) {
    local_1a8 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102e8d;
    dVar7 = wctime();
    pFVar2 = local_1a8;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102eaa;
    fprintf(pFVar2,"[% 8.2f] Encoding falling diagonals...\n",dVar7 - t_start);
  }
  else {
    local_1a0 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102e58;
    dVar7 = wctime();
    pFVar2 = local_1a0;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102e75;
    fprintf(pFVar2,"[% 8.2f] Encoding falling diagonals... ",dVar7 - t_start);
  }
  for (j_3 = 0; sVar6 = j_3, j_3 < size; j_3 = j_3 + 1) {
    if (report_minor != 0) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ee7;
      printf("%zu... ",sVar6);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102ef6;
      fflush(_stdout);
    }
    for (k_3 = 0; k_3 < size; k_3 = k_3 + 1) {
      vars = local_30;
      for (i_6 = 0; BVar5 = vars, i_6 < size; i_6 = i_6 + 1) {
        if (((i_6 <= k_3 + j_3) && (k_3 + j_3 < size + i_6)) && (i_6 != j_3)) {
          local_1b0 = vars;
          BVar5 = *(BDD *)(local_f8 + (i_6 * size + ((k_3 + j_3) - i_6)) * 8);
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102fca;
          BVar4 = sylvan_not(BVar5);
          BVar5 = local_1b0;
          *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102fdb;
          vars = sylvan_and_RUN(BVar5,BVar4,0);
        }
      }
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x102fff;
      local_1b8 = sylvan_not(BVar5);
      BVar5 = *(BDD *)(local_f8 + (j_3 * size + k_3) * 8);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10302f;
      BVar5 = sylvan_not(BVar5);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103037;
      BVar4 = sylvan_not(BVar5);
      BVar5 = local_1b8;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103048;
      BVar5 = sylvan_and_RUN(BVar5,BVar4,0);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103050;
      BVar4 = sylvan_not(BVar5);
      BVar5 = temp;
      vars = BVar4;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103063;
      temp = sylvan_and_RUN(BVar5,BVar4,0);
    }
  }
  if (report_minor != 0) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1030ac;
    printf("\n");
  }
  if (report_minterms != 0) {
    local_1c8 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1030cb;
    local_1c0 = wctime();
    BVar5 = temp;
    sVar6 = i_1;
    local_1c0 = local_1c0 - t_start;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1030ea;
    dVar8 = sylvan_satcount_RUN(BVar5,sVar6,0);
    dVar7 = local_1c0;
    pFVar2 = local_1c8;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10310a;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",dVar7,dVar8);
  }
  if (report_minor == 0) {
    local_1d8 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10315e;
    dVar7 = wctime();
    pFVar2 = local_1d8;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10317b;
    fprintf(pFVar2,"[% 8.2f] Final computation to place a queen on every row...\n",dVar7 - t_start);
  }
  else {
    local_1d0 = _stdout;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103129;
    dVar7 = wctime();
    pFVar2 = local_1d0;
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103146;
    fprintf(pFVar2,"[% 8.2f] Final computation to place a queen on every row... ",dVar7 - t_start);
  }
  for (j_4 = 0; sVar6 = j_4, j_4 < size; j_4 = j_4 + 1) {
    if (report_minor != 0) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1031b8;
      printf("%zu... ",sVar6);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1031c7;
      fflush(_stdout);
    }
    vars = one;
    for (t2 = 0.0; BVar4 = temp, BVar5 = vars, (ulong)t2 < size; t2 = (double)((long)t2 + 1)) {
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1031f3;
      local_1e0 = sylvan_not(BVar5);
      BVar5 = *(BDD *)(local_f8 + (j_4 * size + (long)t2) * 8);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103223;
      BVar4 = sylvan_not(BVar5);
      BVar5 = local_1e0;
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103234;
      BVar5 = sylvan_and_RUN(BVar5,BVar4,0);
      *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10323c;
      vars = sylvan_not(BVar5);
    }
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103263;
    temp = sylvan_and_RUN(BVar4,BVar5,0);
  }
  if (report_minor != 0) {
    *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103295;
    printf("\n");
  }
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10329a;
  w_local = (WorkerP *)wctime();
  local_210 = _stdout;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1032b8;
  local_200 = wctime();
  BVar5 = temp;
  sVar6 = i_1;
  local_200 = local_200 - t_start;
  local_208 = size;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1032e5;
  dVar8 = sylvan_satcount_RUN(BVar5,sVar6,0);
  dVar7 = local_200;
  sVar6 = local_208;
  pFVar2 = local_210;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10330c;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",dVar7,dVar8,sVar6);
  local_1f8 = _stdout;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103322;
  local_1f0 = wctime();
  BVar5 = temp;
  local_1f0 = local_1f0 - t_start;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10333b;
  sVar6 = mtbdd_nodecount(BVar5);
  dVar7 = local_1f0;
  pFVar2 = local_1f8;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10335b;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",dVar7,sVar6);
  local_1e8 = _stdout;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x103371;
  dVar7 = wctime();
  pFVar2 = local_1e8;
  dVar8 = (double)w_local - (double)zero;
  *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x10339b;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",dVar7 - t_start,dVar8);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}